

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

int Smt_PrsBuildConstant(Wlc_Ntk_t *pNtk,char *pStr,int nBits,char *pName)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  word *pwVar4;
  uint *p;
  int local_54;
  int iObj_1;
  int fFound;
  char *pHex;
  Vec_Int_t *vFanins;
  int local_38;
  int iObj;
  int nDigits;
  int i;
  char *pName_local;
  char *pcStack_20;
  int nBits_local;
  char *pStr_local;
  Wlc_Ntk_t *pNtk_local;
  
  _nDigits = pName;
  pName_local._4_4_ = nBits;
  pcStack_20 = pStr;
  pStr_local = (char *)pNtk;
  pHex = (char *)Vec_IntAlloc(10);
  if (*pcStack_20 == '#') {
    if (pcStack_20[1] == 'b') {
      if (pName_local._4_4_ == -1) {
        sVar3 = strlen(pcStack_20 + 2);
        pName_local._4_4_ = (int)sVar3;
      }
      pcVar1 = pHex;
      iVar2 = Abc_BitWordNum(pName_local._4_4_);
      Vec_IntFill((Vec_Int_t *)pcVar1,iVar2,0);
      for (iObj = 0; iObj < pName_local._4_4_; iObj = iObj + 1) {
        if (pcStack_20[iObj + 2] == '1') {
          p = (uint *)Vec_IntArray((Vec_Int_t *)pHex);
          Abc_InfoSetBit(p,(pName_local._4_4_ + -1) - iObj);
        }
        else if (pcStack_20[iObj + 2] != '0') {
          Vec_IntFree((Vec_Int_t *)pHex);
          return 0;
        }
      }
    }
    else {
      if (pcStack_20[1] != 'x') {
        Vec_IntFree((Vec_Int_t *)pHex);
        return 0;
      }
      if (pName_local._4_4_ == -1) {
        sVar3 = strlen(pcStack_20 + 2);
        pName_local._4_4_ = (int)(sVar3 << 2);
      }
      pcVar1 = pHex;
      iVar2 = Abc_BitWordNum(pName_local._4_4_);
      Vec_IntFill((Vec_Int_t *)pcVar1,iVar2,0);
      pwVar4 = (word *)Vec_IntArray((Vec_Int_t *)pHex);
      local_38 = Abc_TtReadHexNumber(pwVar4,pcStack_20 + 2);
      if (local_38 != (pName_local._4_4_ + 3) / 4) {
        Vec_IntFree((Vec_Int_t *)pHex);
        return 0;
      }
    }
  }
  else {
    if ((*pcStack_20 < '0') || ('9' < *pcStack_20)) {
      iVar2 = Abc_NamStrFindOrAdd(*(Abc_Nam_t **)(pStr_local + 0x2b0),pcStack_20,&local_54);
      if (local_54 != 0) {
        Vec_IntFree((Vec_Int_t *)pHex);
        return iVar2;
      }
      __assert_fail("fFound",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                    ,0x272,"int Smt_PrsBuildConstant(Wlc_Ntk_t *, char *, int, char *)");
    }
    _iObj_1 = Smt_GetHexFromDecimalString(pcStack_20);
    if (pName_local._4_4_ == -1) {
      sVar3 = strlen(_iObj_1);
      pName_local._4_4_ = (int)(sVar3 << 2);
    }
    pcVar1 = pHex;
    iVar2 = Abc_BitWordNum(pName_local._4_4_);
    Vec_IntFill((Vec_Int_t *)pcVar1,iVar2,0);
    pwVar4 = (word *)Vec_IntArray((Vec_Int_t *)pHex);
    local_38 = Abc_TtReadHexNumber(pwVar4,_iObj_1);
    if (_iObj_1 != (char *)0x0) {
      free(_iObj_1);
      _iObj_1 = (char *)0x0;
    }
  }
  vFanins._4_4_ =
       Smt_PrsCreateNode((Wlc_Ntk_t *)pStr_local,6,0,pName_local._4_4_,(Vec_Int_t *)pHex,_nDigits);
  Vec_IntFree((Vec_Int_t *)pHex);
  return vFanins._4_4_;
}

Assistant:

static inline int Smt_PrsBuildConstant( Wlc_Ntk_t * pNtk, char * pStr, int nBits, char * pName )
{
    int i, nDigits, iObj;
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    if ( pStr[0] != '#' ) // decimal
    {
        if ( pStr[0] >= '0' && pStr[0] <= '9' )
        {
            // added: sanity check for large constants
            /*
            Vec_Int_t * temp = Vec_IntAlloc(10);
            int fullBits = -1;
            Smt_GetBinaryFromDecimalString(pStr,temp,&fullBits);
            Vec_IntFree(temp);
            assert(fullBits < 32);*/

            char * pHex = Smt_GetHexFromDecimalString(pStr);
            
            if ( nBits == -1 )
                nBits = strlen(pHex)*4;
            
            //printf("nbits: %d\n",nBits);
            
            Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
            nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pHex );
            ABC_FREE( pHex );
            
            /*
            int w, nWords, Number = atoi( pStr );
            if ( nBits == -1 )
            {
                nBits = Abc_Base2Log( Number+1 );
                assert( nBits < 32 );
            }
            nWords = Abc_BitWordNum( nBits );
            for ( w = 0; w < nWords; w++ )
                Vec_IntPush( vFanins, w ? 0 : Number );
            */
        }
        else
        {
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            Vec_IntFree( vFanins );
            return iObj;
        }
    }
    else if ( pStr[1] == 'b' ) // binary
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2);
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
            {
                Vec_IntFree( vFanins );
                return 0;
            }
    }
    else if ( pStr[1] == 'x' ) // hexadecimal
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2)*4;
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
        if ( nDigits != (nBits + 3)/4 )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
    }
    else 
    {
        Vec_IntFree( vFanins );
        return 0;
    }
    // create constant node
    iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_CONST, 0, nBits, vFanins, pName );
    Vec_IntFree( vFanins );
    return iObj;
}